

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

bool QStyleSheetStyle::isNaturalChild(QObject *obj)

{
  byte bVar1;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  undefined1 in_stack_ffffffffffffffc0 [16];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::objectName();
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_);
  bVar1 = QString::startsWith((QLatin1String *)local_20,(CaseSensitivity)QVar2.m_size);
  QString::~QString((QString *)0x4453cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bVar1 & 1) != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::isNaturalChild(const QObject *obj)
{
    if (obj->objectName().startsWith("qt_"_L1))
        return true;

    return false;
}